

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

bool Cipher::subbreak1(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  pointer piVar1;
  TProb TVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  mapped_type_conflict *pmVar6;
  TClusters *pTVar7;
  int i_1;
  int iVar8;
  int i;
  long lVar9;
  long lVar10;
  float letterFreqCost;
  int local_1ac;
  float local_1a8;
  int local_1a4;
  int nLetters;
  int local_19c;
  TFreqMap *local_198;
  TProb local_190;
  TClusters *local_188;
  int local_17c;
  TClusterPos clusterPos;
  TClusterCount clusterCount;
  TLetterCount letterCount;
  TClusterToLetterMap cura;
  TPlainText plainText;
  TClusterToLetterMap besta;
  TClusterToLetterMap itera;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> fixed;
  
  plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  clusterPos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clusterPos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clusterPos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nLetters = 0;
  letterFreqCost = 0.0;
  local_198 = freqMap;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&besta._M_t,&(result->clMap)._M_t);
  local_188 = &result->clusters;
  getRandomCLMap(params,local_188,&besta);
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fixed._M_t._M_impl.super__Rb_tree_header._M_header;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fixed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar10 = 0;
  pTVar7 = local_188;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar9 = 0;
      piVar1 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar9 < (int)((ulong)((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      lVar9 = lVar9 + 1) {
    if (-1 < *(int *)((long)piVar1 + lVar10)) {
      pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](&fixed,(key_type_conflict *)
                                 ((long)(pTVar7->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar10));
      *pmVar6 = true;
      pTVar7 = local_188;
    }
    lVar10 = lVar10 + 4;
  }
  anon_unknown.dwarf_45b5b::calcHelpers
            (params,&besta,pTVar7,&plainText,&letterCount,&clusterCount,&clusterPos,&nLetters,
             &letterFreqCost);
  TVar2 = calcScore1(params,local_198,&plainText,letterFreqCost);
  local_1a8 = (float)TVar2;
  iVar5 = params->nSubbreakIterations;
  local_1ac = 0;
  while( true ) {
    pTVar7 = local_188;
    if (iVar5 == 0) break;
    if (local_1ac < 100) {
      local_1ac = local_1ac + 1;
    }
    else {
      getRandomCLMap(params,local_188,(TClusterToLetterMap *)&besta._M_t);
      anon_unknown.dwarf_45b5b::calcHelpers
                (params,(TClusterToLetterMap *)&besta._M_t,pTVar7,&plainText,&letterCount,
                 &clusterCount,&clusterPos,&nLetters,&letterFreqCost);
      TVar2 = calcScore1(params,local_198,&plainText,letterFreqCost);
      local_1a8 = (float)TVar2;
      local_1ac = 0;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree(&itera._M_t,&besta._M_t);
    local_1a4 = nLetters;
    for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
      do {
        iVar4 = rand();
        cura._M_t._M_impl._0_4_ = iVar4 % params->maxClusters;
        local_19c = rand();
        local_19c = local_19c % params->maxClusters;
      } while (cura._M_t._M_impl._0_4_ == local_19c);
      pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](&fixed,(key_type_conflict *)&cura);
      if ((*pmVar6 == false) &&
         (pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[](&fixed,&local_19c), *pmVar6 == false)) {
        anon_unknown.dwarf_45b5b::updateHelpers
                  (params,&clusterCount,&clusterPos,local_1a4,cura._M_t._M_impl._0_4_,local_19c,
                   &itera,&plainText,&letterCount,&letterFreqCost);
      }
    }
    local_17c = iVar5 + -1;
    local_190 = calcScore1(params,local_198,&plainText,letterFreqCost);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree(&cura._M_t,&itera._M_t);
    for (iVar8 = 0; iVar5 = local_17c, iVar8 < 10; iVar8 = iVar8 + 1) {
      do {
        iVar5 = rand();
        iVar5 = iVar5 % params->maxClusters;
        iVar4 = rand();
        iVar4 = iVar4 % params->maxClusters;
      } while (iVar5 == iVar4);
      anon_unknown.dwarf_45b5b::updateHelpers
                (params,&clusterCount,&clusterPos,local_1a4,iVar5,iVar4,&cura,&plainText,
                 &letterCount,&letterFreqCost);
      TVar2 = calcScore1(params,local_198,&plainText,letterFreqCost);
      if (TVar2 <= local_190) {
        anon_unknown.dwarf_45b5b::updateHelpers
                  (params,&clusterCount,&clusterPos,local_1a4,iVar5,iVar4,&cura,&plainText,
                   &letterCount,&letterFreqCost);
      }
      else {
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::operator=(&itera._M_t,&cura._M_t);
        iVar8 = 0;
        local_190 = TVar2;
      }
    }
    if ((double)local_1a8 < local_190) {
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::operator=(&besta._M_t,&itera._M_t);
      local_1a8 = (float)local_190;
      dVar3 = (double)local_1a8;
      local_1ac = 0;
      if (result->p <= dVar3 && dVar3 != result->p) {
        result->p = dVar3;
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::operator=(&(result->clMap)._M_t,&besta._M_t);
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&cura._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&itera._M_t);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&fixed._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&besta._M_t);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&clusterPos);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&clusterCount.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&letterCount.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&plainText.super__Vector_base<int,_std::allocator<int>_>);
  return true;
}

Assistant:

bool subbreak1(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {

        // helpers
        TPlainText plainText;
        TLetterCount letterCount;
        TClusterCount clusterCount;
        TClusterPos clusterPos;

        int nLetters = 0;
        float letterFreqCost = 0.0f;

        const auto & clusters = result.clusters;
        auto & clMap = result.clMap;
        auto & minBestP = result.p;

        auto besta = clMap;
        getRandomCLMap(params, clusters, besta);

        std::map<TLetter, bool> fixed;
        for (int i = 0; i < (int) params.hint.size(); ++i) {
            if (params.hint[i] < 0) continue;
            fixed[clusters[i]] = true;
        }

        ::calcHelpers(params, besta, clusters, plainText, letterCount, clusterCount, clusterPos, nLetters, letterFreqCost);
        float bestp = calcScore1(params, freqMap, plainText, letterFreqCost);

        int nIters = 0;
        int nMainIters = params.nSubbreakIterations;
        while (nMainIters--) {
            if (++nIters > 100) {
                getRandomCLMap(params, clusters, besta);

                ::calcHelpers(params, besta, clusters, plainText, letterCount, clusterCount, clusterPos, nLetters, letterFreqCost);
                bestp = calcScore1(params, freqMap, plainText, letterFreqCost);

                nIters = 0;
            }

            auto itera = besta;

            int nswaps = 3;
            for (int i = 0; i < nswaps; ++i) {
                int a0 = rand()%params.maxClusters;
                int a1 = rand()%params.maxClusters;
                while (a0 == a1) {
                    a0 = rand()%params.maxClusters;
                    a1 = rand()%params.maxClusters;
                }

                if (fixed[a0] || fixed[a1]) {
                } else {
                    //std::swap(itera[a0], itera[a1]);
                    ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, itera, plainText, letterCount, letterFreqCost);
                }
            }

            auto iterp = calcScore1(params, freqMap, plainText, letterFreqCost);

            auto cura = itera;
            for (int i = 0; i < 10; ++i) {
                int a0 = rand()%params.maxClusters;
                int a1 = rand()%params.maxClusters;
                while (a0 == a1) {
                    a0 = rand()%params.maxClusters;
                    a1 = rand()%params.maxClusters;
                }

                //std::swap(cura[a0], cura[a1]);
                ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, cura, plainText, letterCount, letterFreqCost);
                auto curp = calcScore1(params, freqMap, plainText, letterFreqCost);

                if (curp > iterp) {
                    iterp = curp;
                    itera = cura;
                    i = 0;
                } else {
					//std::swap(cura[a0], cura[a1]);
                    ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, cura, plainText, letterCount, letterFreqCost);
                }
            }

            if (iterp > bestp) {
                besta = itera;
                bestp = iterp;

                if (bestp > minBestP) {
                    minBestP = bestp;
                    clMap = besta;
                }
                nIters = 0;
            }
        }

        return true;
    }